

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradeSchoolMultiplication.cpp
# Opt level: O1

Num * __thiscall
gradeSchoolMultiplication::multiply
          (Num *__return_storage_ptr__,gradeSchoolMultiplication *this,Num *n1,Num *n2)

{
  string *this_00;
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  Short SVar4;
  Short SVar5;
  short sVar6;
  int iVar7;
  Byte BVar8;
  Byte BVar9;
  char *pcVar10;
  long lVar11;
  pointer pcVar12;
  int i;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long *local_50 [2];
  long local_40 [2];
  
  SVar4 = Num::getSize(n1);
  SVar5 = Num::getSize(n2);
  Num::createNumber(__return_storage_ptr__,__return_storage_ptr__,SVar5 + SVar4);
  sVar6 = 0;
  iVar13 = 0;
  iVar14 = 0;
  while( true ) {
    SVar4 = Num::getSize(n1);
    SVar5 = Num::getSize(n2);
    if ((int)((uint)SVar5 + (uint)SVar4 + -2) < iVar13) break;
    SVar4 = Num::getSize(n1);
    iVar15 = iVar13 - (uint)SVar4;
    if ((int)(iVar13 - (uint)SVar4) < 0) {
      iVar15 = -1;
    }
    iVar16 = -2 - iVar15;
    while( true ) {
      SVar4 = Num::getSize(n2);
      iVar7 = SVar4 - 1;
      if (iVar13 <= (int)(SVar4 - 1)) {
        iVar7 = iVar13;
      }
      if (iVar7 <= iVar15) break;
      SVar4 = Num::getSize(n1);
      BVar8 = Num::getDigit(n1,SVar4 + sVar6 + (short)iVar15);
      SVar4 = Num::getSize(n2);
      BVar9 = Num::getDigit(n2,SVar4 + (short)iVar16);
      iVar14 = iVar14 + BVar9 * BVar8;
      iVar16 = iVar16 + -1;
      iVar15 = iVar15 + 1;
    }
    Num::setDigit(__return_storage_ptr__,(Short)iVar13,iVar14 % 10);
    iVar13 = iVar13 + 1;
    sVar6 = sVar6 + -1;
    iVar14 = iVar14 / 10;
  }
  SVar4 = Num::getSize(n1);
  SVar5 = Num::getSize(n2);
  Num::setDigit(__return_storage_ptr__,(SVar5 + SVar4) - 1,iVar14 % 10);
  this_00 = &__return_storage_ptr__->base;
  pcVar2 = (__return_storage_ptr__->base)._M_dataplus._M_p;
  sVar3 = (__return_storage_ptr__->base)._M_string_length;
  pcVar12 = pcVar2 + (sVar3 - 1);
  if (pcVar2 < pcVar12 && sVar3 != 0) {
    do {
      pcVar10 = pcVar2 + 1;
      cVar1 = *pcVar2;
      *pcVar2 = *pcVar12;
      *pcVar12 = cVar1;
      pcVar12 = pcVar12 + -1;
      pcVar2 = pcVar10;
    } while (pcVar10 < pcVar12);
  }
  lVar11 = std::__cxx11::string::find((char *)this_00,0x105004,0);
  if (lVar11 == 0) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)this_00);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    __return_storage_ptr__->size = __return_storage_ptr__->size - 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Num gradeSchoolMultiplication :: multiply(const Num& n1, const Num& n2)
{
    int basis = 10;

    Num result = result.createNumber(n1.getSize()  + n2.getSize());

    int total = 0;

    for (int i = 0; i <= n1.getSize() + n2.getSize() - 2 ; i++)
    {
        for (int j = std::max(0, i - n1.getSize() + 1); j <= std::min(i, n2.getSize() - 1); j++)
        {
            int n2_dig = i - j;
            total += (n1.getDigit(n1.getSize() - n2_dig - 1) * n2.getDigit(n2.getSize() - j - 1));
        }

        result.setDigit(i, (total % basis));
        total /= basis;
    }

    result.setDigit(n1.getSize() + n2.getSize()-1, (total % basis));

    std::reverse(result.base.begin(), result.base.end());

    if (result.base.find("0") == 0)
    {
        result.base = result.base.substr(1);
        result.size = result.size -1;
    }

    return result;


}